

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_result.cpp
# Opt level: O1

int __thiscall cpp_db::sqlite_result::get_column_index(sqlite_result *this,string *column_name)

{
  const_iterator cVar1;
  ostream *poVar2;
  runtime_error *this_00;
  stringstream message;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->column_names)._M_h,column_name);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(int *)((long)cVar1.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          ._M_cur + 0x28);
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(&local_190,"Column \'",8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (&local_190,(column_name->_M_dataplus)._M_p,column_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' not found!",0xc);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  *(undefined ***)this_00 = &PTR__runtime_error_00199840;
  __cxa_throw(this_00,&db_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int sqlite_result::get_column_index(const std::string &column_name) const
{
    auto pos = column_names.find(column_name);
    if (pos != column_names.end())
        return pos->second;
    std::stringstream message;
    message << "Column '" << column_name << "' not found!";
    throw db_exception(message.str());
}